

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidatorTests.cpp
# Opt level: O2

int testVisionFeatureScenePrintBasic(void)

{
  bool bVar1;
  ImageFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  FeatureDescription *pFVar2;
  FeatureDescription *pFVar3;
  ostream *poVar4;
  VisionFeaturePrint *this_04;
  ostream *this_05;
  VisionFeaturePrint_Scene *pVVar5;
  int iVar6;
  char *pcVar7;
  undefined1 auStack_a8 [40];
  Result result;
  Model model;
  
  this = (ImageFeatureType *)operator_new(0x38);
  CoreML::Specification::ImageFeatureType::ImageFeatureType(this);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_imagetype(this_00,this);
  this_01 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_01);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_02,this_01);
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this_03->input_);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this_03->output_);
  if (pFVar2->type_ != (FeatureType *)0x0) {
    (*(pFVar2->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar2->type_ = this_00;
  if (pFVar3->type_ != (FeatureType *)0x0) {
    (*(pFVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar3->type_ = this_02;
  CoreML::Specification::Model::Model(&model);
  if (model.description_ != (ModelDescription *)0x0) {
    (*((model.description_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  model.description_ = this_03;
  CoreML::validate<(MLModelType)2002>(&result,&model);
  bVar1 = CoreML::Result::good(&result);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x29);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((result).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    this_04 = CoreML::Specification::Model::mutable_visionfeatureprint(&model);
    CoreML::validate<(MLModelType)2002>((Result *)auStack_a8,&model);
    CoreML::Result::operator=(&result,(Result *)auStack_a8);
    std::__cxx11::string::~string((string *)(auStack_a8 + 8));
    bVar1 = CoreML::Result::good(&result);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                              );
      this_05 = (ostream *)std::operator<<(poVar4,":");
      iVar6 = 0x2d;
LAB_00162580:
      poVar4 = (ostream *)std::ostream::operator<<(this_05,iVar6);
      poVar4 = std::operator<<(poVar4,": error: ");
      pcVar7 = "!((result).good())";
    }
    else {
      CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene(this_04);
      CoreML::validate<(MLModelType)2002>((Result *)auStack_a8,&model);
      CoreML::Result::operator=(&result,(Result *)auStack_a8);
      std::__cxx11::string::~string((string *)(auStack_a8 + 8));
      bVar1 = CoreML::Result::good(&result);
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                );
        this_05 = (ostream *)std::operator<<(poVar4,":");
        iVar6 = 0x31;
        goto LAB_00162580;
      }
      pVVar5 = CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene(this_04);
      pVVar5->version_ = 1;
      CoreML::validate<(MLModelType)2002>((Result *)auStack_a8,&model);
      CoreML::Result::operator=(&result,(Result *)auStack_a8);
      std::__cxx11::string::~string((string *)(auStack_a8 + 8));
      bVar1 = CoreML::Result::good(&result);
      iVar6 = 0;
      if (bVar1) goto LAB_001625c1;
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x35);
      poVar4 = std::operator<<(poVar4,": error: ");
      pcVar7 = "(result).good()";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  iVar6 = 1;
LAB_001625c1:
  std::__cxx11::string::~string((string *)&result.m_message);
  CoreML::Specification::Model::~Model(&model);
  return iVar6;
}

Assistant:

int testVisionFeatureScenePrintBasic() {

    Specification::ImageFeatureType* inputImageFeatureType = new Specification::ImageFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_imagetype(inputImageFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *preprocessing = model.mutable_visionfeatureprint();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}